

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O2

void test_master_table_delete(planck_unit_test_t *tc)

{
  MasterTable *this;
  MasterTable *in_RSI;
  
  this = (MasterTable *)operator_new(0x50);
  ion_init_master_table();
  master_table_setup(tc,in_RSI);
  master_table_init(tc,in_RSI);
  MasterTable::~MasterTable(this);
  operator_delete(this);
  return;
}

Assistant:

void
test_master_table_delete(
	planck_unit_test_t *tc
) {
	MasterTable *master_table = new MasterTable();

	master_table_setup(tc, master_table);
	master_table_init(tc, master_table);
	delete master_table;
}